

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_int_t ngx_radix128tree_delete(ngx_radix_tree_t *tree,u_char *key,u_char *mask)

{
  ngx_radix_node_t **ppnVar1;
  ngx_radix_node_t *pnVar2;
  ngx_radix_node_t *pnVar3;
  ngx_radix_node_t *pnVar4;
  ngx_radix_node_t *pnVar5;
  long lVar6;
  uint uVar7;
  
  pnVar2 = tree->root;
  if (pnVar2 == (ngx_radix_node_t *)0x0) {
    return -1;
  }
  uVar7 = 0x80;
  lVar6 = 0;
  while ((uVar7 & mask[lVar6]) != 0) {
    pnVar2 = (&pnVar2->right)[(uVar7 & key[lVar6]) == 0];
    uVar7 = uVar7 >> 1;
    if (uVar7 == 0) {
      lVar6 = lVar6 + 1;
      uVar7 = 0x80;
      if (lVar6 == 0x10) {
        if (pnVar2 == (ngx_radix_node_t *)0x0) {
          return -1;
        }
        break;
      }
    }
    if (pnVar2 == (ngx_radix_node_t *)0x0) {
      return -1;
    }
  }
  if ((pnVar2->right == (ngx_radix_node_t *)0x0) && (pnVar2->left == (ngx_radix_node_t *)0x0)) {
    pnVar4 = tree->free;
    pnVar5 = pnVar2->parent;
    do {
      pnVar3 = pnVar2;
      (&pnVar5->right)[pnVar5->right != pnVar3] = (ngx_radix_node_t *)0x0;
      pnVar3->right = pnVar4;
      if (((pnVar5->right != (ngx_radix_node_t *)0x0) || (pnVar5->left != (ngx_radix_node_t *)0x0))
         || (pnVar5->value != 0xffffffffffffffff)) break;
      ppnVar1 = &pnVar5->parent;
      pnVar2 = pnVar5;
      pnVar4 = pnVar3;
      pnVar5 = *ppnVar1;
    } while (*ppnVar1 != (ngx_radix_node_t *)0x0);
    tree->free = pnVar3;
  }
  else {
    if (pnVar2->value == 0xffffffffffffffff) {
      return -1;
    }
    pnVar2->value = 0xffffffffffffffff;
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_radix128tree_delete(ngx_radix_tree_t *tree, u_char *key, u_char *mask)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    node = tree->root;

    while (node && (bit & mask[i])) {
        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}